

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Node * init_desg_expr(C_Parser *parser,InitDesg *desg,C_Token *tok)

{
  C_Node *pCVar1;
  C_Node *rhs_00;
  C_Node *rhs;
  C_Node *lhs;
  C_Node *node;
  C_Token *tok_local;
  InitDesg *desg_local;
  C_Parser *parser_local;
  
  if (desg->var == (C_Obj *)0x0) {
    if (desg->member == (C_Member *)0x0) {
      pCVar1 = init_desg_expr(parser,desg->next,tok);
      rhs_00 = new_num(parser,(long)desg->idx,tok);
      pCVar1 = new_add(parser,pCVar1,rhs_00,tok);
      parser_local = (C_Parser *)new_unary(parser,ND_DEREF,pCVar1,tok);
    }
    else {
      pCVar1 = init_desg_expr(parser,desg->next,tok);
      parser_local = (C_Parser *)new_unary(parser,ND_MEMBER,pCVar1,tok);
      (parser_local->keywords).buckets = (HashEntry_conflict *)desg->member;
    }
  }
  else {
    parser_local = (C_Parser *)new_var_node(parser,desg->var,tok);
  }
  return (C_Node *)parser_local;
}

Assistant:

static C_Node *init_desg_expr(C_Parser *parser, InitDesg *desg, C_Token *tok) {
  if (desg->var)
    return new_var_node(parser, desg->var, tok);

  if (desg->member) {
    C_Node *node = new_unary(parser, ND_MEMBER, init_desg_expr(parser, desg->next, tok), tok);
    node->member = desg->member;
    return node;
  }

  C_Node *lhs = init_desg_expr(parser, desg->next, tok);
  C_Node *rhs = new_num(parser, desg->idx, tok);
  return new_unary(parser, ND_DEREF, new_add(parser, lhs, rhs, tok), tok);
}